

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint8_t uVar4;
  uint uVar5;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar6;
  container_t *pcVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  roaring_array_t *sa;
  uint16_t uVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_85;
  uint8_t local_84;
  uint8_t local_83;
  uint16_t local_82;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  roaring_array_t *local_68;
  void *local_60;
  ulong local_58;
  roaring_array_t *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_83 = '\0';
  uVar10 = (x1->high_low_container).size;
  prVar6 = x2;
  if (uVar10 != 0) {
    uVar5 = (x2->high_low_container).size;
    local_70 = (ulong)uVar5;
    prVar6 = x1;
    if (uVar5 != 0) {
      local_68 = &x1->high_low_container;
      ra = &roaring_bitmap_create_with_capacity(uVar5 + uVar10)->high_low_container;
      if (((local_68->flags & 1) == 0) || (((x2->high_low_container).flags & 1) == 0)) {
        ra->flags = ra->flags & 0xfe;
      }
      else {
        ra->flags = ra->flags | 1;
      }
      uVar11 = *local_68->keys;
      local_82 = *(x2->high_low_container).keys;
      local_58 = (ulong)-uVar10;
      local_80 = 0;
      pvVar12 = (void *)0x0;
      local_50 = &x2->high_low_container;
      local_38 = (ulong)uVar10;
LAB_00116e33:
      do {
        local_78 = (ulong)pvVar12 & 0xffffffff;
        iVar9 = (int)local_58 + (int)pvVar12;
        local_40 = (long)(int)pvVar12;
        local_48 = local_40 * 8;
        lVar14 = 0;
        local_60 = pvVar12;
        while( true ) {
          sa = local_50;
          uVar8 = local_78;
          uVar1 = local_78 + lVar14;
          iVar13 = (int)lVar14;
          uVar10 = (uint)local_80;
          if (uVar11 == local_82) break;
          if (local_82 <= uVar11) {
            local_85 = local_50->typecodes[local_80 & 0xffff];
            pcVar7 = get_copy_of_container
                               (local_50->containers[local_80 & 0xffff],&local_85,
                                (_Bool)(local_50->flags & 1));
            uVar4 = local_85;
            if ((sa->flags & 1) != 0) {
              if (((roaring_array_t *)&sa->size)->size <= (int)uVar10) goto LAB_001171ae;
              sa->containers[(int)uVar10] = pcVar7;
              sa->typecodes[(int)uVar10] = local_85;
            }
            extend_array(ra,1);
            iVar9 = ra->size;
            ra->keys[iVar9] = local_82;
            ra->containers[iVar9] = pcVar7;
            ra->typecodes[iVar9] = uVar4;
            ra->size = ra->size + 1;
            uVar10 = (int)local_80 + 1;
            if (uVar10 != (uint)local_70) {
              local_82 = sa->keys[(ulong)uVar10 & 0xffff];
            }
            if (uVar10 == (uint)local_70) {
              uVar5 = iVar13 + (int)local_78;
              goto LAB_00117146;
            }
            pvVar12 = (void *)(ulong)(uint)((int)local_78 + iVar13);
            local_80 = (ulong)uVar10;
            goto LAB_00116e33;
          }
          uVar8 = uVar1 & 0xffff;
          local_84 = local_68->typecodes[uVar8];
          pcVar7 = get_copy_of_container
                             (local_68->containers[uVar8],&local_84,(_Bool)(local_68->flags & 1));
          uVar4 = local_84;
          if ((local_68->flags & 1) != 0) {
            if (local_68->size <= (int)uVar1) {
LAB_001171ae:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            *(container_t **)((long)local_68->containers + lVar14 * 8 + local_48) = pcVar7;
            local_68->typecodes[lVar14 + local_40] = local_84;
          }
          extend_array(ra,1);
          iVar3 = ra->size;
          ra->keys[iVar3] = uVar11;
          ra->containers[iVar3] = pcVar7;
          ra->typecodes[iVar3] = uVar4;
          ra->size = ra->size + 1;
          if (iVar9 + iVar13 != -1) {
            uVar11 = local_68->keys[(ushort)((short)local_78 + (short)lVar14 + 1)];
          }
          lVar14 = lVar14 + 1;
          if ((int)lVar14 + iVar9 == 0) {
            uVar5 = (int)local_60 + (int)lVar14;
            uVar10 = (uint)local_80;
            sa = local_50;
            goto LAB_00117146;
          }
        }
        uVar15 = (int)local_78 + iVar13;
        local_40 = CONCAT62(local_40._2_6_,uVar11);
        uVar5 = uVar15 & 0xffff;
        local_84 = local_68->typecodes[uVar5];
        local_85 = local_50->typecodes[uVar10 & 0xffff];
        local_60 = container_or(local_68->containers[uVar5],local_84,
                                local_50->containers[uVar10 & 0xffff],local_85,&local_83);
        local_48 = CONCAT71(local_48._1_7_,local_83);
        extend_array(ra,1);
        iVar9 = ra->size;
        ra->keys[iVar9] = (uint16_t)local_40;
        ra->containers[iVar9] = local_60;
        ra->typecodes[iVar9] = (uint8_t)local_48;
        ra->size = ra->size + 1;
        pvVar12 = (void *)(uVar8 + lVar14 + 1);
        uVar10 = uVar10 + 1;
        if (uVar10 == (uint)local_70 || uVar15 + (int)local_58 == -1) {
          uVar5 = iVar13 + (int)local_78 + 1;
LAB_00117146:
          if (uVar5 == (uint)local_38) {
            bVar2 = sa->flags;
            uVar15 = (uint)local_70;
            uVar5 = uVar10;
          }
          else {
            if (uVar10 != (uint)local_70) {
              return (roaring_bitmap_t *)ra;
            }
            bVar2 = local_68->flags;
            sa = local_68;
            uVar15 = (uint)local_38;
          }
          ra_append_copy_range(ra,sa,uVar5,uVar15,(_Bool)(bVar2 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar11 = local_68->keys[(uint)pvVar12 & 0xffff];
        local_82 = sa->keys[uVar10 & 0xffff];
        local_80 = (ulong)uVar10;
      } while( true );
    }
  }
  prVar6 = roaring_bitmap_copy(prVar6);
  return prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or(const roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_or(c1, type1, c2, type2, &result_type);

            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            // c1 = container_clone(c1, type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // c2 = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}